

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::
     bitfield_insert_invalid_offset_type(NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType insertDataType;
  bool bVar1;
  char *__s;
  long lVar2;
  long lVar3;
  string shaderSource;
  DataType in_stack_ffffffffffffff30;
  allocator<char> local_c5;
  ShaderType local_c4;
  long local_c0;
  long local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"bitfieldInsert: Invalid offset type.",(allocator<char> *)&local_90
            );
  NegativeTestContext::beginSection(ctx,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    shaderType = (&(anonymous_namespace)::s_shaders)[lVar3];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      local_c0 = lVar3;
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_c5);
      std::operator+(&local_b0,"Verify shader: ",&local_90);
      NegativeTestContext::beginSection(ctx,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
        local_c4 = (&(anonymous_namespace)::s_intTypes)[lVar3];
        lVar2 = 0;
        while (lVar2 != 0x2c) {
          insertDataType = *(DataType *)((long)&(anonymous_namespace)::s_nonScalarIntTypes + lVar2);
          local_b8 = lVar2;
          (anonymous_namespace)::genShaderSourceBitfieldInsert_abi_cxx11_
                    (&local_b0,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                     ,local_c4,local_c4,insertDataType,TYPE_INT,in_stack_ffffffffffffff30);
          std::__cxx11::string::string((string *)&local_50,(string *)&local_b0);
          verifyShader(ctx,shaderType,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_b0);
          (anonymous_namespace)::genShaderSourceBitfieldInsert_abi_cxx11_
                    (&local_b0,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                     ,(&(anonymous_namespace)::s_uintTypes)[lVar3],
                     (&(anonymous_namespace)::s_uintTypes)[lVar3],insertDataType,TYPE_INT,
                     in_stack_ffffffffffffff30);
          std::__cxx11::string::string((string *)&local_70,(string *)&local_b0);
          verifyShader(ctx,shaderType,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_b0);
          lVar2 = local_b8 + 4;
        }
      }
      NegativeTestContext::endSection(ctx);
      lVar3 = local_c0;
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void bitfield_insert_invalid_offset_type (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_intTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	ctx.beginSection("bitfieldInsert: Invalid offset type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_intTypes); ++dataTypeNdx)
			{
				for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_nonScalarIntTypes); ++dataTypeNdx2)
				{
					{
						const std::string shaderSource(genShaderSourceBitfieldInsert(ctx, s_shaders[shaderNdx], s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx], s_nonScalarIntTypes[dataTypeNdx2], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceBitfieldInsert(ctx, s_shaders[shaderNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_nonScalarIntTypes[dataTypeNdx2], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}